

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O2

region * __thiscall
toml::detail::repeat_exact::scan(region *__return_storage_ptr__,repeat_exact *this,location *loc)

{
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var1;
  ulong uVar2;
  location first;
  region reg;
  location lStack_d8;
  region local_90;
  
  location::location(&lStack_d8,loc);
  uVar2 = 0;
  do {
    if (this->length_ <= uVar2) {
      region::region(__return_storage_ptr__,&lStack_d8,loc);
LAB_003067f2:
      location::~location(&lStack_d8);
      return __return_storage_ptr__;
    }
    _Var1._M_head_impl =
         (this->other_).scanner_._M_t.
         super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
         ._M_t.
         super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
         .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
    (*(_Var1._M_head_impl)->_vptr_scanner_base[2])(&local_90,_Var1._M_head_impl,loc);
    if (local_90.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      location::operator=(loc,&lStack_d8);
      region::region(__return_storage_ptr__);
      region::~region(&local_90);
      goto LAB_003067f2;
    }
    region::~region(&local_90);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

TOML11_INLINE region repeat_exact::scan(location& loc) const
{
    const auto first = loc;
    for(std::size_t i=0; i<length_; ++i)
    {
        const auto reg = other_.scan(loc);
        if( ! reg.is_ok())
        {
            loc = first;
            return region{};
        }
    }
    return region(first, loc);
}